

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O3

void iterator_set_del_docs_test(void)

{
  ulong uVar1;
  uint uVar2;
  fdb_status fVar3;
  size_t keylen;
  size_t metalen;
  size_t bodylen;
  long lVar4;
  char *__format;
  ulong uVar5;
  fdb_kvs_handle *kv1;
  fdb_iterator *it;
  fdb_file_handle *dbfile;
  fdb_doc *vdoc;
  fdb_kvs_info info;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char bodybuf [256];
  fdb_config fconfig;
  char metabuf [256];
  char keybuf [256];
  fdb_kvs_handle *local_7e8;
  uint local_7dc;
  ulong local_7d8;
  fdb_iterator *local_7d0;
  fdb_file_handle *local_7c8;
  fdb_doc **local_7c0;
  fdb_doc *local_7b8;
  fdb_kvs_info local_7b0;
  timeval local_780;
  fdb_kvs_config local_770;
  char local_758 [256];
  fdb_doc *apfStack_658 [101];
  fdb_config local_330;
  char local_238 [256];
  char local_138 [264];
  
  gettimeofday(&local_780,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  local_330.wal_threshold = 0x400;
  local_330.flags = 1;
  local_330.compaction_threshold = '\n';
  local_330.purging_interval = 1;
  fdb_open(&local_7c8,"./iterator_test1",&local_330);
  fdb_kvs_open(local_7c8,&local_7e8,"kv1",&local_770);
  local_7d8 = 0;
  uVar2 = 0;
  do {
    lVar4 = 0;
    uVar5 = 0;
    local_7dc = uVar2;
    do {
      uVar2 = local_7dc;
      sprintf(local_138,"key%02d%03d",(ulong)local_7dc,uVar5 & 0xffffffff);
      sprintf(local_238,"meta%02d%03d",(ulong)uVar2,uVar5 & 0xffffffff);
      sprintf(local_758,"body%02d%03d",(ulong)uVar2,uVar5 & 0xffffffff);
      local_7c0 = (fdb_doc **)((long)apfStack_658 + lVar4);
      keylen = strlen(local_138);
      metalen = strlen(local_238);
      bodylen = strlen(local_758);
      fdb_doc_create(local_7c0,local_138,keylen,local_238,metalen,local_758,bodylen);
      fdb_set(local_7e8,apfStack_658[uVar5]);
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 8;
    } while (uVar5 != 100);
    fdb_commit(local_7c8,'\x01');
    lVar4 = 0;
    do {
      fdb_del(local_7e8,apfStack_658[lVar4 + 0x19]);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x19);
    uVar5 = local_7d8 + 0x4b;
    fdb_commit(local_7c8,'\x01');
    fdb_get_kvs_info(local_7e8,&local_7b0);
    local_7d8 = uVar5;
    if (local_7b0.doc_count != uVar5) {
      uVar5 = 0;
      fdb_iterator_init(local_7e8,&local_7d0,(void *)0x0,0,(void *)0x0,0,0);
      do {
        fdb_iterator_get(local_7d0,&local_7b8);
        uVar5 = (ulong)((int)uVar5 + (local_7b8->deleted ^ 1));
        fdb_doc_free(local_7b8);
        fVar3 = fdb_iterator_next(local_7d0);
      } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
      fdb_iterator_close(local_7d0);
      uVar1 = local_7d8;
      printf("dbdocs(%d) expected(%d)\n",uVar5,local_7d8 & 0xffffffff);
      if (local_7b0.doc_count != uVar1) {
        iterator_set_del_docs_test();
      }
    }
    lVar4 = 0;
    do {
      fdb_doc_free(apfStack_658[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 100);
    uVar2 = local_7dc + 1;
  } while (uVar2 != 0x14);
  fdb_kvs_close(local_7e8);
  fdb_close(local_7c8);
  fdb_shutdown();
  memleak_end();
  __format = "%s PASSED\n";
  if (iterator_set_del_docs_test()::__test_pass != '\0') {
    __format = "%s FAILED\n";
  }
  fprintf(_stderr,__format,"iterator set del docs");
  return;
}

Assistant:

void iterator_set_del_docs_test()
{
    TEST_INIT();
    memleak_start();

    int r;
    int i, j, k, n=100;
    int expected_doc_count=0;
    char keybuf[256], metabuf[256], bodybuf[256];
    int val2;
    fdb_file_handle *dbfile;
    fdb_iterator *it;
    fdb_kvs_handle *kv1;
    fdb_kvs_info info;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *vdoc;
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 10;
    fconfig.purging_interval = 1; //retain deletes until compaction

    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);

    for(k=0;k<20;++k){
        // set n docs
        for(i=0;i<n;++i){
            sprintf(keybuf, "key%02d%03d", k, i);
            sprintf(metabuf, "meta%02d%03d", k, i);
            sprintf(bodybuf, "body%02d%03d", k, i);
            fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
            fdb_set(kv1, doc[i]);
            expected_doc_count++;
        }

        // commit
        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

        // delete subset of recently loaded docs
        for(j=n/4;j<n/2;j++){
            fdb_del(kv1, doc[j]);
            expected_doc_count--;
        }
        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

        fdb_get_kvs_info(kv1, &info);
        if(info.doc_count != (size_t)expected_doc_count){
            // test already failed further debugging check info
            fdb_iterator_init(kv1, &it, NULL, 0,
                              NULL, 0, FDB_ITR_NONE);
            val2=0;
            do {
                fdb_iterator_get(it, &vdoc);
                if (!vdoc->deleted){
                    val2++;
                }
                fdb_doc_free(vdoc);
            } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
            fdb_iterator_close(it);
            printf("dbdocs(%d) expected(%d)\n", val2, expected_doc_count);
        }
        TEST_CHK(info.doc_count == (size_t)expected_doc_count);

        // preliminary cleanup
        for(i=0;i<n;++i){
            fdb_doc_free(doc[i]);
        }
    }

    fdb_kvs_close(kv1);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();

    TEST_RESULT("iterator set del docs");
}